

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O2

DdNode * Cudd_addUnivAbstract(DdManager *manager,DdNode *f,DdNode *cube)

{
  int iVar1;
  DdNode *pDVar2;
  
  iVar1 = addCheckPositiveCube(manager,cube);
  if (iVar1 == 0) {
    fwrite("Error:  Can only abstract cubes",0x1f,1,(FILE *)manager->err);
    pDVar2 = (DdNode *)0x0;
  }
  else {
    do {
      manager->reordered = 0;
      pDVar2 = cuddAddUnivAbstractRecur(manager,f,cube);
    } while (manager->reordered == 1);
  }
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addUnivAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode              *res;

    if (addCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,"Error:  Can only abstract cubes");
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddAddUnivAbstractRecur(manager, f, cube);
    } while (manager->reordered == 1);

    return(res);

}